

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

ByteArray *
ot::commissioner::internal::ExtractRouterIds(ByteArray *__return_storage_ptr__,ByteArray *aMask)

{
  byte *pbVar1;
  byte local_29;
  ulong local_28;
  size_t i;
  ByteArray *local_18;
  ByteArray *aMask_local;
  ByteArray *routerIdList;
  
  i._7_1_ = 0;
  local_18 = aMask;
  aMask_local = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_18,local_28 >> 3);
    if (((uint)*pbVar1 & 0x80 >> ((byte)local_28 & 7)) != 0) {
      local_29 = (byte)local_28;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_29);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray internal::ExtractRouterIds(const ByteArray &aMask)
{
    ByteArray routerIdList;

    for (size_t i = 0; i < kRouterIdMaskBytes * 8; i++)
    {
        if ((aMask[i / 8] & (0x80 >> (i % 8))) != 0)
        {
            routerIdList.push_back(i);
        }
    }

    return routerIdList;
}